

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocs.c
# Opt level: O3

void free_relocs(void)

{
  reloc_s *prVar1;
  
  cur = root;
  if (root != (reloc_t *)0x0) {
    do {
      prVar1 = cur->next;
      free(cur);
      cur = prVar1;
    } while (prVar1 != (reloc_s *)0x0);
  }
  root = (reloc_t *)0x0;
  cur = (reloc_t *)0x0;
  return;
}

Assistant:

void free_relocs()
{
    reloc_t* next = root;
    while (next)
    {
        cur = next;
        next = cur->next;
        free(cur);
    }
    root = NULL;
    cur = NULL;
}